

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_boundary_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
               (void)

{
  _Hash_node_base *p_Var1;
  pointer ppVar2;
  pointer pvVar3;
  pointer puVar4;
  Column_zp_settings *this;
  mapped_type *pmVar5;
  _Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_false>
  __it;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint local_2ac;
  uint *local_2a8;
  uint *local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  undefined8 local_288;
  shared_count sStack_280;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  uint **local_260;
  undefined **local_258;
  undefined1 local_250;
  undefined8 *local_248;
  uint **local_240;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char *local_220;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  char *local_200;
  char *local_1f8;
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  m;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  ::
  Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
              *)&m.matrix_,&columns,this);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
            (&columns,&m);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x359);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  local_2a0 = &local_2ac;
  local_2ac = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_2a8 = &local_294;
  local_294 = 7;
  local_290[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 7;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_240 = &local_2a0;
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa038;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_280);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x35b);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_2a0 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_2ac = 6;
  local_290[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 6;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa038;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_2ac;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (local_290,&local_238,&local_200,0x35b,1,2,2,"m.get_current_barcode().back().death",
             &local_258,"6",&local_278);
  boost::detail::shared_count::~shared_count(&sStack_280);
  if (m.matrix_.nextInsertIndex_ != 0) {
    m.matrix_.nextInsertIndex_ = m.matrix_.nextInsertIndex_ - 1;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&m.matrix_.matrix_,&m.matrix_.nextInsertIndex_);
    m.matrix_.super_Matrix_dimension_option.dimensions_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start[(uint)(pmVar5->super_Column_dimension_option).dim_] =
         m.matrix_.super_Matrix_dimension_option.dimensions_.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[(uint)(pmVar5->super_Column_dimension_option).dim_] - 1;
    puVar4 = m.matrix_.super_Matrix_dimension_option.dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      m.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      if (m.matrix_.super_Matrix_dimension_option.dimensions_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          m.matrix_.super_Matrix_dimension_option.dimensions_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      puVar4 = m.matrix_.super_Matrix_dimension_option.dimensions_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
    } while (m.matrix_.super_Matrix_dimension_option.dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] == 0);
    m.matrix_.super_Matrix_dimension_option.maxDim_ =
         (int)((ulong)((long)m.matrix_.super_Matrix_dimension_option.dimensions_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)m.matrix_.super_Matrix_dimension_option.dimensions_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) + -1;
    p_Var6 = m.matrix_.matrix_._M_h._M_buckets
             [(ulong)m.matrix_.nextInsertIndex_ % m.matrix_.matrix_._M_h._M_bucket_count];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       m.matrix_.nextInsertIndex_ != *(Index *)&p_Var6->_M_nxt[1]._M_nxt)) {
      while (p_Var6 = p_Var1, p_Var1 = p_Var6->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var1[1]._M_nxt % m.matrix_.matrix_._M_h._M_bucket_count !=
             (ulong)m.matrix_.nextInsertIndex_ % m.matrix_.matrix_._M_h._M_bucket_count) ||
           (p_Var7 = p_Var6, m.matrix_.nextInsertIndex_ == *(uint *)&p_Var1[1]._M_nxt))
        goto LAB_0017e07d;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0017e07d:
    if (p_Var7 == (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      __it._M_cur = (__node_type *)p_Var7->_M_nxt;
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&m.matrix_.matrix_._M_h,(const_iterator)__it._M_cur);
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
    ::_remove_last(&m.matrix_.super_Base_pairing_option,m.matrix_.nextInsertIndex_);
  }
  ppVar2 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar3 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar3->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar3 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  ppVar2 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
            (&columns,&m);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x363);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  local_2ac = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_290[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 6;
  local_294 = 6;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_2a0 = &local_2ac;
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa038;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_294;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_280);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x364);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_2a0 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_2ac = 0xffffffff;
  local_290[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 0xffffffff;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa038;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_2ac;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa038;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (local_290,&local_238,&local_200,0x364,1,2,2,"m.get_current_barcode().back().death",
             &local_258,"Matrix::template get_null_value<typename Matrix::ID_index>()",&local_278);
  boost::detail::shared_count::~shared_count(&sStack_280);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_boundary_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  // pairing always true for boundary for now (only thing differentiating it from base)
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);

  m.remove_last();

  columns.pop_back();
  columns[5].clear();  // was reduced

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, Matrix::template get_null_value<typename Matrix::ID_index>());
}